

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O1

ltc_store_data * __thiscall ltc::get_store_data(ltc_store_data *__return_storage_ptr__,ltc *this)

{
  mat3 framed_mtx;
  float local_3c;
  float local_34;
  float local_2c;
  float local_24;
  float local_1c;
  
  get_framed_ltc_matrix(this);
  (__return_storage_ptr__->matrix_parameters)._M_elems[0] = local_2c * local_1c;
  (__return_storage_ptr__->matrix_parameters)._M_elems[1] = -local_34 * local_2c;
  (__return_storage_ptr__->matrix_parameters)._M_elems[2] =
       local_1c * local_3c - local_24 * local_34;
  (__return_storage_ptr__->matrix_parameters)._M_elems[3] = -local_2c * local_24;
  (__return_storage_ptr__->matrix_parameters)._M_elems[4] = local_3c * local_2c;
  __return_storage_ptr__->distribution_norm = this->_amplitude;
  __return_storage_ptr__->fresnel_term = this->_fresnel;
  return __return_storage_ptr__;
}

Assistant:

ltc_store_data ltc::get_store_data() const
{
  auto framed_mtx = get_framed_ltc_matrix();

  float a = framed_mtx[0][0];
  float b = framed_mtx[0][2];
  float c = framed_mtx[1][1];
  float d = framed_mtx[2][0];
  float e = framed_mtx[2][2];

  // Rescaled inverse of m:
  // a 0 b   inverse  c*e     0     -b*c
  // 0 c 0     ==>     0  a*e - b*d   0
  // d 0 e           -c*d     0      a*c

  float t0 = c * e;
  float t1 = -b * c;
  float t2 = a * e - b * d;
  float t3 = -c * d;
  float t4 = a * c;

  ltc_store_data store_data;
  store_data.matrix_parameters = {t0, t1, t2, t3, t4};
  store_data.distribution_norm = _amplitude;
  store_data.fresnel_term = _fresnel;

  return store_data;
}